

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harvest.cc
# Opt level: O0

void sptk::world::anon_unknown_2::SearchF0Base
               (double **f0_candidates,double **f0_scores,int f0_length,int number_of_candidates,
               double *base_f0_contour)

{
  int j;
  int i;
  double tmp_best_score;
  double *base_f0_contour_local;
  int number_of_candidates_local;
  int f0_length_local;
  double **f0_scores_local;
  double **f0_candidates_local;
  
  for (i = 0; i < f0_length; i = i + 1) {
    tmp_best_score = 0.0;
    base_f0_contour[i] = 0.0;
    for (j = 0; j < number_of_candidates; j = j + 1) {
      if (tmp_best_score < f0_scores[i][j]) {
        base_f0_contour[i] = f0_candidates[i][j];
        tmp_best_score = f0_scores[i][j];
      }
    }
  }
  return;
}

Assistant:

static void SearchF0Base(const double * const *f0_candidates,
    const double * const *f0_scores, int f0_length, int number_of_candidates,
    double *base_f0_contour) {
  double tmp_best_score;
  for (int i = 0; i < f0_length; ++i) {
    base_f0_contour[i] = tmp_best_score = 0.0;
    for (int j = 0; j < number_of_candidates; ++j)
      if (f0_scores[i][j] > tmp_best_score) {
        base_f0_contour[i] = f0_candidates[i][j];
        tmp_best_score = f0_scores[i][j];
      }
  }
}